

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AttributeSpecifier
          (SyntaxDumper *this,ExtGNU_AttributeSpecifierSyntax *node)

{
  ExtGNU_AttributeSpecifierSyntax local_148 [56];
  ExtGNU_AttributeSpecifierSyntax local_110 [56];
  ExtGNU_AttributeListSyntax *local_d8;
  ExtGNU_AttributeListSyntax *iter;
  ExtGNU_AttributeSpecifierSyntax local_98 [72];
  ExtGNU_AttributeSpecifierSyntax local_50 [56];
  ExtGNU_AttributeSpecifierSyntax *local_18;
  ExtGNU_AttributeSpecifierSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ExtGNU_AttributeSpecifierSyntax *)this;
  ExtGNU_AttributeSpecifierSyntax::attributeKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  ExtGNU_AttributeSpecifierSyntax::openOuterParenthesisToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  ExtGNU_AttributeSpecifierSyntax::openInnerParenthesisToken
            ((ExtGNU_AttributeSpecifierSyntax *)&iter);
  (**(code **)(*(long *)this + 0x2e8))(this,(ExtGNU_AttributeSpecifierSyntax *)&iter,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)&iter);
  for (local_d8 = ExtGNU_AttributeSpecifierSyntax::attributes(local_18);
      local_d8 != (ExtGNU_AttributeListSyntax *)0x0;
      local_d8 = *(ExtGNU_AttributeListSyntax **)(local_d8 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_d8 + 8));
  }
  ExtGNU_AttributeSpecifierSyntax::closeInnerParenthesisToken(local_110);
  (**(code **)(*(long *)this + 0x2e8))(this,local_110,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_110);
  ExtGNU_AttributeSpecifierSyntax::closeOuterParenthesisToken(local_148);
  (**(code **)(*(long *)this + 0x2e8))(this,local_148,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_148);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AttributeSpecifier(const ExtGNU_AttributeSpecifierSyntax* node) override
    {
        terminal(node->attributeKeyword(), node);
        terminal(node->openOuterParenthesisToken(), node);
        terminal(node->openInnerParenthesisToken(), node);
        for (auto iter = node->attributes(); iter; iter = iter->next)
            nonterminal(iter->value);
        terminal(node->closeInnerParenthesisToken(), node);
        terminal(node->closeOuterParenthesisToken(), node);
        return Action::Skip;
    }